

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  Type *pTVar3;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = this;
  pAVar1 = GetArena(this);
  local_51 = 0;
  if (pAVar1 != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x498);
    local_51 = 1;
    pLVar2 = LogMessage::operator<<(&local_50,"CHECK failed: GetArena() == nullptr: ");
    pLVar2 = LogMessage::operator<<
                       (pLVar2,"ReleaseLast() called on a RepeatedPtrField that is on an arena, ");
    pLVar2 = LogMessage::operator<<
                       (pLVar2,"with a type that does not implement MergeFrom. This is unsafe; ");
    pLVar2 = LogMessage::operator<<(pLVar2,"please implement MergeFrom for your type.");
    LogFinisher::operator=(local_65,pLVar2);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  pTVar3 = UnsafeArenaReleaseLast<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     (this);
  return pTVar3;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::false_type) {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseLast() called on a RepeatedPtrField that is on an arena, "
      << "with a type that does not implement MergeFrom. This is unsafe; "
      << "please implement MergeFrom for your type.";
  return UnsafeArenaReleaseLast<TypeHandler>();
}